

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::
Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
::walk(Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
       *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc p_Var4;
  Expression **ppEVar5;
  long lVar6;
  pointer pTVar7;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::NewFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::NewFinder>]"
                 );
  }
  pushTask(this,PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                ::scan,root);
  sVar1 = (this->stack).usedFixed;
  lVar6 = ((long)(this->stack).flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->stack).flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar1;
  while( true ) {
    if (lVar6 == 0) {
      return;
    }
    pTVar2 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::Task, N = 10]"
                     );
      }
      pTVar7 = (pointer)&(this->stack).fixed._M_elems[sVar1 - 1].func;
    }
    else {
      pTVar7 = pTVar3 + -1;
    }
    p_Var4 = pTVar7->func;
    ppEVar5 = pTVar7->currp;
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x75,
                      "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::Task, N = 10]"
                     );
      }
      (this->stack).usedFixed = sVar1 - 1;
    }
    else {
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
    }
    this->replacep = ppEVar5;
    if (*ppEVar5 == (Expression *)0x0) break;
    (*p_Var4)((NewFinder *)this,ppEVar5);
    sVar1 = (this->stack).usedFixed;
    lVar6 = ((long)(this->stack).flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->stack).flexible.
                   super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) + sVar1;
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<wasm::(anonymous namespace)::NewFinder, wasm::Visitor<wasm::(anonymous namespace)::NewFinder>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::NewFinder, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::NewFinder>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }